

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O1

void __thiscall ImplSimd<SimdAVX>::RGB2YUV(ImplSimd<SimdAVX> *this,RGB *rgb,YUV420 *yuv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  if (yuv->height_ != rgb->height_) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3d,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]")
    ;
  }
  if (yuv->width_ == rgb->width_) {
    if ((yuv->size_ & 0xf) == 0) {
      if (yuv->size_ != 0) {
        puVar7 = yuv->y_;
        puVar8 = yuv->u_;
        puVar9 = yuv->v_;
        puVar10 = rgb->r_;
        puVar11 = rgb->g_;
        puVar12 = rgb->b_;
        uVar15 = 0;
        auVar16._8_2_ = 0x42;
        auVar16._0_8_ = 0x42004200420042;
        auVar16._10_2_ = 0x42;
        auVar16._12_2_ = 0x42;
        auVar16._14_2_ = 0x42;
        auVar16._16_2_ = 0x42;
        auVar16._18_2_ = 0x42;
        auVar16._20_2_ = 0x42;
        auVar16._22_2_ = 0x42;
        auVar16._24_2_ = 0x42;
        auVar16._26_2_ = 0x42;
        auVar16._28_2_ = 0x42;
        auVar16._30_2_ = 0x42;
        auVar17._8_2_ = 0x19;
        auVar17._0_8_ = 0x19001900190019;
        auVar17._10_2_ = 0x19;
        auVar17._12_2_ = 0x19;
        auVar17._14_2_ = 0x19;
        auVar17._16_2_ = 0x19;
        auVar17._18_2_ = 0x19;
        auVar17._20_2_ = 0x19;
        auVar17._22_2_ = 0x19;
        auVar17._24_2_ = 0x19;
        auVar17._26_2_ = 0x19;
        auVar17._28_2_ = 0x19;
        auVar17._30_2_ = 0x19;
        auVar18._8_2_ = 0x80;
        auVar18._0_8_ = 0x80008000800080;
        auVar18._10_2_ = 0x80;
        auVar18._12_2_ = 0x80;
        auVar18._14_2_ = 0x80;
        auVar18._16_2_ = 0x80;
        auVar18._18_2_ = 0x80;
        auVar18._20_2_ = 0x80;
        auVar18._22_2_ = 0x80;
        auVar18._24_2_ = 0x80;
        auVar18._26_2_ = 0x80;
        auVar18._28_2_ = 0x80;
        auVar18._30_2_ = 0x80;
        auVar19._8_2_ = 0x10;
        auVar19._0_8_ = 0x10001000100010;
        auVar19._10_2_ = 0x10;
        auVar19._12_2_ = 0x10;
        auVar19._14_2_ = 0x10;
        auVar19._16_2_ = 0x10;
        auVar19._18_2_ = 0x10;
        auVar19._20_2_ = 0x10;
        auVar19._22_2_ = 0x10;
        auVar19._24_2_ = 0x10;
        auVar19._26_2_ = 0x10;
        auVar19._28_2_ = 0x10;
        auVar19._30_2_ = 0x10;
        auVar20._8_2_ = 0x70;
        auVar20._0_8_ = 0x70007000700070;
        auVar20._10_2_ = 0x70;
        auVar20._12_2_ = 0x70;
        auVar20._14_2_ = 0x70;
        auVar20._16_2_ = 0x70;
        auVar20._18_2_ = 0x70;
        auVar20._20_2_ = 0x70;
        auVar20._22_2_ = 0x70;
        auVar20._24_2_ = 0x70;
        auVar20._26_2_ = 0x70;
        auVar20._28_2_ = 0x70;
        auVar20._30_2_ = 0x70;
        auVar21._8_2_ = 0xffda;
        auVar21._0_8_ = 0xffdaffdaffdaffda;
        auVar21._10_2_ = 0xffda;
        auVar21._12_2_ = 0xffda;
        auVar21._14_2_ = 0xffda;
        auVar21._16_2_ = 0xffda;
        auVar21._18_2_ = 0xffda;
        auVar21._20_2_ = 0xffda;
        auVar21._22_2_ = 0xffda;
        auVar21._24_2_ = 0xffda;
        auVar21._26_2_ = 0xffda;
        auVar21._28_2_ = 0xffda;
        auVar21._30_2_ = 0xffda;
        auVar22._8_2_ = 0xffb6;
        auVar22._0_8_ = 0xffb6ffb6ffb6ffb6;
        auVar22._10_2_ = 0xffb6;
        auVar22._12_2_ = 0xffb6;
        auVar22._14_2_ = 0xffb6;
        auVar22._16_2_ = 0xffb6;
        auVar22._18_2_ = 0xffb6;
        auVar22._20_2_ = 0xffb6;
        auVar22._22_2_ = 0xffb6;
        auVar22._24_2_ = 0xffb6;
        auVar22._26_2_ = 0xffb6;
        auVar22._28_2_ = 0xffb6;
        auVar22._30_2_ = 0xffb6;
        auVar23._8_2_ = 0xffa2;
        auVar23._0_8_ = 0xffa2ffa2ffa2ffa2;
        auVar23._10_2_ = 0xffa2;
        auVar23._12_2_ = 0xffa2;
        auVar23._14_2_ = 0xffa2;
        auVar23._16_2_ = 0xffa2;
        auVar23._18_2_ = 0xffa2;
        auVar23._20_2_ = 0xffa2;
        auVar23._22_2_ = 0xffa2;
        auVar23._24_2_ = 0xffa2;
        auVar23._26_2_ = 0xffa2;
        auVar23._28_2_ = 0xffa2;
        auVar23._30_2_ = 0xffa2;
        auVar24._8_2_ = 0xffee;
        auVar24._0_8_ = 0xffeeffeeffeeffee;
        auVar24._10_2_ = 0xffee;
        auVar24._12_2_ = 0xffee;
        auVar24._14_2_ = 0xffee;
        auVar24._16_2_ = 0xffee;
        auVar24._18_2_ = 0xffee;
        auVar24._20_2_ = 0xffee;
        auVar24._22_2_ = 0xffee;
        auVar24._24_2_ = 0xffee;
        auVar24._26_2_ = 0xffee;
        auVar24._28_2_ = 0xffee;
        auVar24._30_2_ = 0xffee;
        do {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(puVar10 + uVar15);
          auVar1 = vpmovzxbw_avx(auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(puVar10 + uVar15 + 8);
          auVar2 = vpmovzxbw_avx(auVar2);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(puVar11 + uVar15);
          auVar3 = vpmovzxbw_avx(auVar3);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(puVar11 + uVar15 + 8);
          auVar4 = vpmovzxbw_avx(auVar4);
          auVar25._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar26._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
          auVar26._16_16_ = ZEXT116(1) * auVar4;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(puVar12 + uVar15);
          auVar1 = vpmovzxbw_avx(auVar5);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(puVar12 + uVar15 + 8);
          auVar2 = vpmovzxbw_avx(auVar6);
          auVar27._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar13 = vpmullw_avx2(auVar25,auVar16);
          auVar28 = vpsllw_avx2(auVar26,7);
          auVar28 = vpaddw_avx2(auVar26,auVar28);
          auVar28 = vpaddw_avx2(auVar13,auVar28);
          auVar13 = vpmullw_avx2(auVar27,auVar17);
          auVar13 = vpaddw_avx2(auVar13,auVar18);
          auVar28 = vpaddw_avx2(auVar28,auVar13);
          auVar28 = vpsraw_avx2(auVar28,8);
          auVar28 = vpaddw_avx2(auVar28,auVar19);
          auVar1 = vpacksswb_avx(auVar28._0_16_,auVar28._16_16_);
          *(undefined1 (*) [16])(puVar7 + uVar15) = auVar1;
          auVar13 = vpmullw_avx2(auVar27,auVar20);
          auVar28 = vpmullw_avx2(auVar25,auVar21);
          auVar14 = vpmullw_avx2(auVar26,auVar22);
          auVar28 = vpaddw_avx2(auVar28,auVar14);
          auVar13 = vpaddw_avx2(auVar13,auVar18);
          auVar28 = vpaddw_avx2(auVar28,auVar13);
          auVar28 = vpsraw_avx2(auVar28,8);
          auVar28 = vpaddw_avx2(auVar28,auVar18);
          auVar1 = vpacksswb_avx(auVar28._0_16_,auVar28._16_16_);
          *(undefined1 (*) [16])(puVar8 + uVar15) = auVar1;
          auVar28 = vpmullw_avx2(auVar25,auVar20);
          auVar13 = vpmullw_avx2(auVar26,auVar23);
          auVar28 = vpaddw_avx2(auVar28,auVar13);
          auVar13 = vpmullw_avx2(auVar27,auVar24);
          auVar13 = vpaddw_avx2(auVar13,auVar18);
          auVar28 = vpaddw_avx2(auVar28,auVar13);
          auVar28 = vpsraw_avx2(auVar28,8);
          auVar28 = vpaddw_avx2(auVar28,auVar18);
          auVar1 = vpacksswb_avx(auVar28._0_16_,auVar28._16_16_);
          *(undefined1 (*) [16])(puVar9 + uVar15) = auVar1;
          uVar15 = uVar15 + 0x10;
        } while (uVar15 < yuv->size_);
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3f,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]")
    ;
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x3e,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]");
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}